

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

Fra_Lcr_t * Lcr_ManAlloc(Aig_Man_t *pAig)

{
  int iVar1;
  Fra_Lcr_t *__s;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Fra_Lcr_t *p;
  Aig_Man_t *pAig_local;
  
  __s = (Fra_Lcr_t *)malloc(0x88);
  memset(__s,0,0x88);
  __s->pAig = pAig;
  iVar1 = Aig_ManCiNum(pAig);
  piVar2 = (int *)malloc((long)iVar1 << 2);
  __s->pInToOutPart = piVar2;
  piVar2 = __s->pInToOutPart;
  iVar1 = Aig_ManCiNum(pAig);
  memset(piVar2,0,(long)iVar1 << 2);
  iVar1 = Aig_ManCiNum(pAig);
  piVar2 = (int *)malloc((long)iVar1 << 2);
  __s->pInToOutNum = piVar2;
  piVar2 = __s->pInToOutNum;
  iVar1 = Aig_ManCiNum(pAig);
  memset(piVar2,0,(long)iVar1 << 2);
  pVVar3 = Vec_PtrAlloc(1000);
  __s->vFraigs = pVVar3;
  return __s;
}

Assistant:

Fra_Lcr_t * Lcr_ManAlloc( Aig_Man_t * pAig )
{
    Fra_Lcr_t * p;
    p = ABC_ALLOC( Fra_Lcr_t, 1 );
    memset( p, 0, sizeof(Fra_Lcr_t) );
    p->pAig = pAig;
    p->pInToOutPart = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
    memset( p->pInToOutPart, 0, sizeof(int) * Aig_ManCiNum(pAig) );
    p->pInToOutNum = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
    memset( p->pInToOutNum, 0, sizeof(int) * Aig_ManCiNum(pAig) );
    p->vFraigs = Vec_PtrAlloc( 1000 );
    return p;
}